

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O0

void __thiscall
fasttext::ProductQuantizer::ProductQuantizer(ProductQuantizer *this,int32_t dim,int32_t dsub)

{
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *this_00;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  allocator_type *__a;
  size_type in_stack_ffffffffffffffd8;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffe0;
  allocator_type local_11;
  int local_10;
  
  in_RDI[0] = 8;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *(int *)(in_RDI + 4) = 1 << (*in_RDI & 0x1f);
  in_RDI[8] = 0;
  in_RDI[9] = 1;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 8) * *(int *)(in_RDI + 4);
  in_RDI[0x10] = 0xd2;
  in_RDI[0x11] = 4;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0x19;
  in_RDI[0x15] = 0;
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  in_RDI[0x18] = 0x95;
  in_RDI[0x19] = 0xbf;
  in_RDI[0x1a] = 0xd6;
  in_RDI[0x1b] = 0x33;
  *(int *)(in_RDI + 0x1c) = in_ESI;
  *(int *)(in_RDI + 0x20) = in_ESI / in_EDX;
  *(int *)(in_RDI + 0x24) = in_EDX;
  this_00 = (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)(in_RDI + 0x30)
  ;
  __a = &local_11;
  local_10 = in_EDX;
  std::allocator<float>::allocator((allocator<float> *)0x1aae91);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
  std::allocator<float>::~allocator((allocator<float> *)0x1aaeb1);
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine(this_00,(result_type)in_RDI);
  *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x1c) % local_10;
  if (*(int *)(in_RDI + 0x28) == 0) {
    *(undefined4 *)(in_RDI + 0x28) = *(undefined4 *)(in_RDI + 0x24);
  }
  else {
    *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + 1;
  }
  return;
}

Assistant:

ProductQuantizer::ProductQuantizer(int32_t dim, int32_t dsub)
    : dim_(dim),
      nsubq_(dim / dsub),
      dsub_(dsub),
      centroids_(dim * ksub_),
      rng(seed_) {
  lastdsub_ = dim_ % dsub;
  if (lastdsub_ == 0) {
    lastdsub_ = dsub_;
  } else {
    nsubq_++;
  }
}